

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O2

void __thiscall wasm::LocalAnalyzer::analyze(LocalAnalyzer *this,Function *func)

{
  pointer puVar1;
  _Bit_type *p_Var2;
  undefined8 uVar3;
  undefined4 uVar4;
  _Bvector_impl *p_Var5;
  size_t __new_size;
  size_t sVar6;
  uint uVar7;
  ulong __n;
  reference rVar8;
  _Bit_iterator __last;
  _Bit_iterator __first;
  bool local_31;
  
  __new_size = Function::getNumLocals(func);
  puVar1 = (this->numSets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->numSets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->numSets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->numSets,__new_size);
  puVar1 = (this->numGets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->numGets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->numGets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->numGets,__new_size);
  (this->sfa).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p =
       (this->sfa).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  (this->sfa).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  std::vector<bool,_std::allocator<bool>_>::resize(&this->sfa,__new_size,false);
  p_Var2 = (this->sfa).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  sVar6 = Function::getNumParams(func);
  __first.super__Bit_iterator_base._M_p =
       p_Var2 + (long)sVar6 / 0x40 +
                (ulong)((sVar6 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  __first.super__Bit_iterator_base._M_offset = (uint)sVar6 & 0x3f;
  p_Var5 = &(this->sfa).super__Bvector_base<std::allocator<bool>_>._M_impl;
  uVar3 = (p_Var5->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
  uVar4 = (p_Var5->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._M_offset = uVar4;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar3;
  local_31 = true;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __first.super__Bit_iterator_base._12_4_ = 0;
  std::__fill_a1(__first,__last,&local_31);
  Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>::walk
            ((Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_> *)this,
             &func->body);
  for (uVar7 = 0; __n = (ulong)uVar7, __n < __new_size; uVar7 = uVar7 + 1) {
    if ((this->numSets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[__n] == 0) {
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->sfa,__n);
      *rVar8._M_p = *rVar8._M_p & ~rVar8._M_mask;
    }
  }
  return;
}

Assistant:

void analyze(Function* func) {
    auto num = func->getNumLocals();
    numSets.clear();
    numSets.resize(num);
    numGets.clear();
    numGets.resize(num);
    sfa.clear();
    sfa.resize(num);
    std::fill(sfa.begin() + func->getNumParams(), sfa.end(), true);
    walk(func->body);
    for (Index i = 0; i < num; i++) {
      if (numSets[i] == 0) {
        sfa[i] = false;
      }
    }
  }